

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::kf_move_up_and_sol(Fl_Input *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Fl_Input *this_local;
  
  iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
  iVar2 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar2);
  iVar3 = Fl_Input_::position(&this->super_Fl_Input_);
  if ((iVar2 == iVar3) && (iVar2 = Fl_Input_::position(&this->super_Fl_Input_), 0 < iVar2)) {
    iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
    iVar2 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar2 + -1);
    iVar2 = shift_position(this,iVar2);
    bVar1 = Fl::option(OPTION_ARROW_FOCUS);
    this_local._4_4_ = iVar2 + (uint)!bVar1;
  }
  else {
    iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
    iVar2 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar2);
    iVar2 = shift_position(this,iVar2);
    bVar1 = Fl::option(OPTION_ARROW_FOCUS);
    this_local._4_4_ = iVar2 + (uint)!bVar1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input::kf_move_up_and_sol() {
  if (line_start(position())==position() && position()>0)
    return shift_position(line_start(position()-1)) + NORMAL_INPUT_MOVE;
  else
    return shift_position(line_start(position())) + NORMAL_INPUT_MOVE;
}